

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SafeInt.hpp
# Opt level: O0

void LargeIntRegMultiply<int,_unsigned_long>::
     RegMultiplyThrow<safeint_exception_handlers::SafeInt_InvalidParameter>
               (int32_t a,uint64_t *b,int32_t *pRet)

{
  ulong uVar1;
  int iVar2;
  int32_t iVar3;
  ulong uVar4;
  int32_t *in_RDX;
  ulong *in_RSI;
  uint in_EDI;
  uint64_t tmp;
  bool fIsNegative;
  uint32_t bLow;
  uint32_t bHigh;
  uint local_4;
  
  uVar4 = *in_RSI;
  uVar1 = *in_RSI;
  *in_RDX = 0;
  if (((int)(uVar4 >> 0x20) != 0) && (in_EDI != 0)) {
    safeint_exception_handlers::SafeInt_InvalidParameter::SafeIntOnOverflow();
  }
  local_4 = in_EDI;
  if ((int)in_EDI < 0) {
    local_4 = AbsValueHelper<int,_0>::Abs(0);
  }
  uVar4 = (ulong)local_4 * (uVar1 & 0xffffffff);
  if ((int)in_EDI < 0) {
    iVar2 = std::numeric_limits<int>::max();
    if ((long)iVar2 + 1U < uVar4) goto LAB_0011c18b;
    iVar3 = SignedNegation<int>::Value(uVar4);
    *in_RDX = iVar3;
  }
  else {
    iVar2 = std::numeric_limits<int>::max();
    if ((ulong)(long)iVar2 < uVar4) {
LAB_0011c18b:
      safeint_exception_handlers::SafeInt_InvalidParameter::SafeIntOnOverflow();
    }
    *in_RDX = (int32_t)uVar4;
  }
  return;
}

Assistant:

SAFEINT_CONSTEXPR14 static void RegMultiplyThrow( std::int32_t a, const std::uint64_t& b, std::int32_t* pRet ) SAFEINT_CPP_THROW
    {
        std::uint32_t bHigh = 0, bLow = 0;
        bool fIsNegative = false;

        // Consider that a*b can be broken up into:
        // (aHigh * 2^32 + aLow) * (bHigh * 2^32 + bLow)
        // => (aHigh * bHigh * 2^64) + (aLow * bHigh * 2^32) + (aHigh * bLow * 2^32) + (aLow * bLow)

        bHigh = (std::uint32_t)(b >> 32);
        bLow  = (std::uint32_t)b;

        *pRet = 0;

        if(bHigh != 0 && a != 0)
            E::SafeIntOnOverflow();

        if( a < 0 )
        {
            a = (std::int32_t)AbsValueHelper< std::int32_t, GetAbsMethod< std::int32_t >::method >::Abs(a);
            fIsNegative = true;
        }

        std::uint64_t tmp = (std::uint32_t)a * (std::uint64_t)bLow;

        if( !fIsNegative )
        {
            if( tmp <= (std::uint64_t)std::numeric_limits< std::int32_t >::max() )
            {
                *pRet = (std::int32_t)tmp;
                return;
            }
        }
        else
        {
            if( tmp <= (std::uint64_t)std::numeric_limits< std::int32_t >::max()+1 )
            {
                *pRet = SignedNegation< std::int32_t >::Value( tmp );
                return;
            }
        }

        E::SafeIntOnOverflow();
    }